

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O0

int __thiscall Peers::accept(Peers *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Socket __fd_00;
  ulong uVar1;
  ulong extraout_RAX;
  bool bVar2;
  unique_ptr<Peer,_std::default_delete<Peer>_> local_50;
  SocketResource local_44;
  unique_ptr<Peer,_std::default_delete<Peer>_> local_40;
  unique_ptr<Peer,_std::default_delete<Peer>_> peer;
  socklen_t local_30;
  Socket peerSocket;
  socklen_t len;
  sockaddr_in addr;
  int num;
  Peers *this_local;
  
  addr.sin_zero._0_4_ = this->m_count + 1;
  local_30 = 0x10;
  unique0x10000125 = this;
  peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
  super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.super__Head_base<0UL,_Peer_*,_false>.
  _M_head_impl._0_4_ = P2PSocket::socket(this->m_p2pSocket,__fd,(int)__addr,addr.sin_zero._0_4_);
  __fd_00 = SocketResource::resource((SocketResource *)&peer);
  peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
  super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.super__Head_base<0UL,_Peer_*,_false>.
  _M_head_impl._4_4_ = ::accept(__fd_00,(sockaddr *)&peerSocket,&local_30);
  uVar1 = (ulong)peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                 super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                 super__Head_base<0UL,_Peer_*,_false>._M_head_impl._4_4_;
  bVar2 = peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
          super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
          super__Head_base<0UL,_Peer_*,_false>._M_head_impl._4_4_ != 0xffffffff;
  if (bVar2) {
    SocketResource::SocketResource
              (&local_44,
               peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
               super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
               super__Head_base<0UL,_Peer_*,_false>._M_head_impl._4_4_);
    std::make_unique<Peer,P2PSocket*&,SocketResource,int&>
              ((P2PSocket **)&local_40,(SocketResource *)&this->m_p2pSocket,&local_44.m_socket);
    std::unique_ptr<Peer,_std::default_delete<Peer>_>::unique_ptr(&local_50,&local_40);
    peerIsConnected(this,&local_50);
    std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr(&local_50);
    std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr(&local_40);
    uVar1 = extraout_RAX;
  }
  return (int)CONCAT71((int7)(uVar1 >> 8),bVar2);
}

Assistant:

bool Peers::accept()
{
    int num = m_count + 1;
    sockaddr_in addr;
#ifdef _WIN32
    int len = sizeof(addr);
#else
    socklen_t len = sizeof(addr);
#endif
    Socket peerSocket = ::accept(m_p2pSocket->socket().resource(), (struct sockaddr *)&addr, &len);
    if (peerSocket == INVALID_SOCKET)
        return false;
    std::unique_ptr<Peer> peer =
        std::make_unique<Peer>(m_p2pSocket, SocketResource(peerSocket), num);
    peerIsConnected(std::move(peer));
    return true;
}